

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O2

int __thiscall
QFileSystemModelPrivate::translateVisibleLocation
          (QFileSystemModelPrivate *this,QFileSystemNode *parent,int row)

{
  int iVar1;
  
  if (this->sortOrder != AscendingOrder) {
    iVar1 = parent->dirtyChildrenIndex;
    if (iVar1 == -1) {
      return ~row + (int)(parent->visibleChildren).d.size;
    }
    if (row < iVar1) {
      row = ~row + iVar1;
    }
  }
  return row;
}

Assistant:

inline int translateVisibleLocation(QFileSystemNode *parent, int row) const {
        if (sortOrder != Qt::AscendingOrder) {
            if (parent->dirtyChildrenIndex == -1)
                return parent->visibleChildren.size() - row - 1;

            if (row < parent->dirtyChildrenIndex)
                return parent->dirtyChildrenIndex - row - 1;
        }

        return row;
    }